

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O0

cio_http_cb_return handle_field_value(cio_http_client *client,char *at,size_t length)

{
  cio_websocket_location_handler *wslh_00;
  byte bVar1;
  uint_fast8_t header_field;
  cio_websocket_location_handler *wslh;
  cio_http_cb_return ret;
  size_t length_local;
  char *at_local;
  cio_http_client *client_local;
  
  wslh._4_4_ = CIO_HTTP_CB_SUCCESS;
  wslh_00 = (cio_websocket_location_handler *)client->current_handler;
  bVar1 = *(byte *)&wslh_00->flags & 3;
  if (bVar1 == 1) {
    wslh._4_4_ = save_websocket_key(wslh_00,at,length);
  }
  else if (bVar1 == 2) {
    wslh._4_4_ = check_websocket_version(wslh_00,at,length);
  }
  else if (bVar1 == 3) {
    *(byte *)&wslh_00->flags = *(byte *)&wslh_00->flags & 0xfb | 4;
    wslh._4_4_ = check_websocket_protocol(wslh_00,at,length);
  }
  *(byte *)&wslh_00->flags = *(byte *)&wslh_00->flags & 0xfc;
  return wslh._4_4_;
}

Assistant:

static enum cio_http_cb_return handle_field_value(struct cio_http_client *client, const char *at, size_t length)
{
	enum cio_http_cb_return ret = CIO_HTTP_CB_SUCCESS;

	struct cio_websocket_location_handler *wslh = cio_container_of(client->current_handler, struct cio_websocket_location_handler, http_location);

	uint_fast8_t header_field = (uint_fast8_t)wslh->flags.current_header_field;

	switch (header_field) {
	case CIO_WS_HEADER_SEC_WEBSOCKET_KEY:
		ret = save_websocket_key(wslh, at, length);
		break;

	case CIO_WS_HEADER_SEC_WEBSOCKET_VERSION:
		ret = check_websocket_version(wslh, at, length);
		break;

	case CIO_WS_HEADER_SEC_WEBSOCKET_PROTOCOL:
		wslh->flags.subprotocol_requested = 1;
		ret = check_websocket_protocol(wslh, at, length);
		break;

	default:
		break;
	}

	wslh->flags.current_header_field = CIO_WS_HEADER_UNKNOWN;
	return ret;
}